

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O1

VariablesArray * __thiscall
bal::VariableTextReader::read_variable_value
          (VariablesArray *__return_storage_ptr__,VariableTextReader *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  uint *__src;
  ulong uVar3;
  long lVar4;
  TextReader *pTVar5;
  bool bVar6;
  variableid_t element_size;
  Container<unsigned_int> local_48;
  variableid_t local_34;
  
  p_Var1 = this->_vptr_VariableTextReader[-3];
  pTVar5 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var1);
  TextReader::load_next_token(pTVar5);
  if (*(long *)(&this->field_0x10 + (long)p_Var1) == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = (pTVar5->current_line_)._M_dataplus._M_p[pTVar5->current_token_pos_] == '{';
  }
  if (bVar6) {
    pp_Var2 = this->_vptr_VariableTextReader;
    p_Var1 = pp_Var2[-3];
    if (*(long *)(&this->field_0x10 + (long)p_Var1) != 0) {
      *(long *)(&this->field_0x8 + (long)p_Var1) = *(long *)(&this->field_0x8 + (long)p_Var1) + 1;
      *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
      *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
    }
    p_Var1 = pp_Var2[-3];
    uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var1);
    if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var1)) {
      lVar4 = *(long *)(&this->field_0x10 + (long)p_Var1);
      do {
        uVar3 = uVar3 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var1) + -1 + uVar3) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var1) = uVar3;
        if (lVar4 != 0) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
          lVar4 = 0;
        }
      } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var1));
    }
  }
  local_48.data_ = (uint *)0x0;
  local_48.size_ = 0;
  local_48.allocated_size_ = 0;
  local_34 = 0;
  read_variable_element_(this,&local_48,&local_34);
  if (bVar6) {
    p_Var1 = this->_vptr_VariableTextReader[-3];
    uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var1);
    if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var1)) {
      lVar4 = *(long *)(&this->field_0x10 + (long)p_Var1);
      do {
        uVar3 = uVar3 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var1) + -1 + uVar3) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var1) = uVar3;
        if (lVar4 != 0) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
          lVar4 = 0;
        }
      } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var1));
    }
    do {
      pTVar5 = (TextReader *)
               ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]);
      TextReader::load_next_token(pTVar5);
      if ((pTVar5->current_token_len_ == 0) ||
         ((pTVar5->current_line_)._M_dataplus._M_p[pTVar5->current_token_pos_] != ','))
      goto LAB_00110921;
      pp_Var2 = this->_vptr_VariableTextReader;
      p_Var1 = pp_Var2[-3];
      if (*(long *)(&this->field_0x10 + (long)p_Var1) != 0) {
        *(long *)(&this->field_0x8 + (long)p_Var1) = *(long *)(&this->field_0x8 + (long)p_Var1) + 1;
        *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
      }
      p_Var1 = pp_Var2[-3];
      uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var1);
      if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var1)) {
        lVar4 = *(long *)(&this->field_0x10 + (long)p_Var1);
        do {
          uVar3 = uVar3 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var1) + -1 + uVar3) != ' ') break;
          *(ulong *)(&this->field_0x8 + (long)p_Var1) = uVar3;
          if (lVar4 != 0) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
            lVar4 = 0;
          }
        } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var1));
      }
      read_variable_element_(this,&local_48,&local_34);
      p_Var1 = this->_vptr_VariableTextReader[-3];
      uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var1);
      if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var1)) {
        lVar4 = *(long *)(&this->field_0x10 + (long)p_Var1);
        do {
          uVar3 = uVar3 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var1) + -1 + uVar3) != ' ') break;
          *(ulong *)(&this->field_0x8 + (long)p_Var1) = uVar3;
          if (lVar4 != 0) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
            lVar4 = 0;
          }
        } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var1));
      }
    } while( true );
  }
  goto LAB_00110990;
LAB_00110921:
  TextReader::read_symbol
            ((TextReader *)
             ((long)&this->_vptr_VariableTextReader + (long)this->_vptr_VariableTextReader[-3]),'}')
  ;
  p_Var1 = this->_vptr_VariableTextReader[-3];
  uVar3 = *(ulong *)(&this->field_0x8 + (long)p_Var1);
  if (uVar3 < *(ulong *)(&this->field_0x20 + (long)p_Var1)) {
    lVar4 = *(long *)(&this->field_0x10 + (long)p_Var1);
    do {
      uVar3 = uVar3 + 1;
      if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var1) + -1 + uVar3) != ' ') break;
      *(ulong *)(&this->field_0x8 + (long)p_Var1) = uVar3;
      if (lVar4 != 0) {
        *(undefined8 *)(&this->field_0x10 + (long)p_Var1) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var1) = 0;
        lVar4 = 0;
      }
    } while (uVar3 != *(ulong *)(&this->field_0x20 + (long)p_Var1));
  }
LAB_00110990:
  read_variable_elements_sequence_(this,&local_48,local_48.size_);
  __src = local_48.data_;
  VariablesArray::VariablesArray(__return_storage_ptr__,local_48.size_ / local_34,local_34);
  uVar3 = (ulong)(__return_storage_ptr__->super_Container<unsigned_int>).size_;
  if (uVar3 != 0) {
    memmove((__return_storage_ptr__->super_Container<unsigned_int>).data_,__src,uVar3 << 2);
  }
  if ((local_48.allocated_size_ != 0) && (local_48.data_ != (uint *)0x0)) {
    free(local_48.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

VariablesArray VariableTextReader::read_variable_value() {
        bool is_value_bracket = false;
        if (is_symbol('{')) {
            skip_symbol();
            skip_space();
            is_value_bracket = true;
        };
        
        Container<literalid_t> value;

        // the first element
        variableid_t element_size = 0;
        read_variable_element_(value, element_size);
        
        if (is_value_bracket) {
            // read more elements
            skip_space();
            while (is_symbol(',')) {
                skip_symbol();
                skip_space();
                read_variable_element_(value, element_size);
                skip_space();
            };
            
            read_symbol('}');
            skip_space();
        };
        
        read_variable_elements_sequence_(value, value.size_);
        
        return VariablesArray(value.size_ / element_size, element_size, value.data_);
    }